

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void op_addr_ri_post(DisasContext_conflict1 *s,arg_ldst_ri *a,TCGv_i32 addr,int address_offset)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (a->p == 0) {
    if (a->u == 0) {
      address_offset = address_offset - a->imm;
    }
    else {
      address_offset = address_offset + a->imm;
    }
  }
  else if (a->w == 0) {
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
    return;
  }
  tcg_gen_addi_i32_aarch64(tcg_ctx,addr,addr,address_offset);
  store_reg(s,a->rn,addr);
  return;
}

Assistant:

static void op_addr_ri_post(DisasContext *s, arg_ldst_ri *a,
                            TCGv_i32 addr, int address_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!a->p) {
        if (a->u) {
            address_offset += a->imm;
        } else {
            address_offset -= a->imm;
        }
    } else if (!a->w) {
        tcg_temp_free_i32(tcg_ctx, addr);
        return;
    }
    tcg_gen_addi_i32(tcg_ctx, addr, addr, address_offset);
    store_reg(s, a->rn, addr);
}